

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertiontests.cpp
# Opt level: O1

void anon_unknown.dwarf_608d4::fail(void)

{
  string expected;
  string msg;
  Assert local_90 [6];
  
  local_90[0].m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
  ;
  local_90[0].m_line = 0x10;
  UnitTests::Assert::Fail(local_90);
}

Assistant:

TEST(assert_true1)
    {
        try
        {
            ASSERT_TRUE(1 == 2);
            FAIL("ASSERT_TRUE should have fired here.");
        }
        catch (UnitTests::TestFailure& e)
        {
            std::string msg      = e.what();
            std::string expected = "error A1000: Assertion failure :  Expression evaluated to false";
            if (msg.find(expected) == std::string::npos)
            {
                throw UnitTests::TestFailure("Unexpected message from ASSERT_TRUE", __FILE__, __LINE__);
            }
        }
    }